

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  U32 *pUVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ulong *puVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  uint uVar25;
  ulong *puVar26;
  ulong *puVar27;
  BYTE *pBVar28;
  seqDef *psVar29;
  long lVar30;
  BYTE *pBVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  U32 UVar35;
  ulong *puVar36;
  uint uVar37;
  BYTE *pStart_3;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong local_160;
  uint local_154;
  ulong local_120;
  ulong local_118;
  ulong local_100;
  uint local_90;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar8 = (ms->window).base;
  pBVar9 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar8 + uVar5;
  local_154 = *rep;
  local_90 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar36 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar36 < puVar4) {
    puVar17 = (ulong *)(pBVar9 + uVar5);
    iVar13 = uVar5 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    do {
      UVar35 = (U32)puVar36;
      iVar14 = UVar35 - (int)pBVar8;
      uVar15 = (iVar14 - local_154) + 1;
      pBVar28 = pBVar8;
      if (uVar15 < uVar5) {
        pBVar28 = pBVar9;
      }
      if ((uVar6 < uVar15 && 2 < iVar13 - uVar15) &&
         (*(int *)((long)puVar36 + 1U) == *(int *)(pBVar28 + uVar15))) {
        puVar26 = iEnd;
        if (uVar15 < uVar5) {
          puVar26 = puVar17;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar28 + uVar15) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar26,iStart);
        uVar19 = sVar18 + 4;
      }
      else {
        uVar19 = 0;
      }
      if (cParams->searchLength - 6 < 2) {
        pUVar10 = ms->chainTable;
        uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar15 = (ms->window).dictLimit;
        uVar25 = (ms->window).lowLimit;
        uVar37 = UVar35 - (int)pBVar28;
        uVar34 = uVar37 - uVar33;
        if (uVar37 < uVar33) {
          uVar34 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar25 < uVar16) {
          iVar32 = 1 << ((byte)uVar7 & 0x1f);
          local_118 = 99999999;
          local_160 = 3;
          do {
            uVar20 = (ulong)uVar16;
            if (uVar16 < uVar15) {
              if (*(int *)(pBVar24 + uVar20) == (int)*puVar36) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar24 + uVar20 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar15,pBVar28 + uVar15);
                uVar20 = sVar18 + 4;
LAB_0019809c:
                if ((local_160 < uVar20) &&
                   (local_118 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar20,
                   (ulong *)((long)puVar36 + uVar20) == iEnd)) goto LAB_00198631;
              }
            }
            else {
              puVar26 = (ulong *)(pBVar28 + uVar20);
              if (*(BYTE *)(local_160 + (long)puVar26) == *(BYTE *)((long)puVar36 + local_160)) {
                puVar22 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar26 == *puVar36) {
                    lVar30 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar36 + lVar30 + 8);
                      if (puVar1 <= puVar22) {
                        puVar26 = (ulong *)(pBVar28 + lVar30 + uVar20 + 8);
                        goto LAB_00198056;
                      }
                      lVar11 = lVar30 + uVar20 + 8;
                      lVar30 = lVar30 + 8;
                    } while (*(ulong *)(pBVar28 + lVar11) == *puVar22);
                    uVar21 = *puVar22 ^ *(ulong *)(pBVar28 + lVar11);
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar30;
                  }
                  else {
                    uVar21 = *puVar36 ^ *puVar26;
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = uVar20 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00198056:
                  if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                  }
                  uVar20 = (long)puVar22 - (long)puVar36;
                }
                goto LAB_0019809c;
              }
            }
            if ((uVar16 <= uVar34) ||
               ((uVar16 = pUVar10[uVar16 & uVar33 - 1], uVar16 <= uVar25 ||
                (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00198631;
          } while( true );
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar10 = ms->chainTable;
        uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar15 = (ms->window).dictLimit;
        uVar25 = (ms->window).lowLimit;
        uVar37 = UVar35 - (int)pBVar28;
        uVar34 = uVar37 - uVar33;
        if (uVar37 < uVar33) {
          uVar34 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar25 < uVar16) {
          iVar32 = 1 << ((byte)uVar7 & 0x1f);
          local_118 = 99999999;
          local_160 = 3;
          do {
            uVar20 = (ulong)uVar16;
            if (uVar16 < uVar15) {
              if (*(int *)(pBVar24 + uVar20) == (int)*puVar36) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar24 + uVar20 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar15,pBVar28 + uVar15);
                uVar20 = sVar18 + 4;
LAB_0019833c:
                if ((local_160 < uVar20) &&
                   (local_118 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar20,
                   (ulong *)((long)puVar36 + uVar20) == iEnd)) goto LAB_00198631;
              }
            }
            else {
              puVar26 = (ulong *)(pBVar28 + uVar20);
              if (*(BYTE *)(local_160 + (long)puVar26) == *(BYTE *)((long)puVar36 + local_160)) {
                puVar22 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar26 == *puVar36) {
                    lVar30 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar36 + lVar30 + 8);
                      if (puVar1 <= puVar22) {
                        puVar26 = (ulong *)(pBVar28 + lVar30 + uVar20 + 8);
                        goto LAB_001982f6;
                      }
                      lVar11 = lVar30 + uVar20 + 8;
                      lVar30 = lVar30 + 8;
                    } while (*(ulong *)(pBVar28 + lVar11) == *puVar22);
                    uVar21 = *puVar22 ^ *(ulong *)(pBVar28 + lVar11);
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar30;
                  }
                  else {
                    uVar21 = *puVar36 ^ *puVar26;
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = uVar20 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001982f6:
                  if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                  }
                  uVar20 = (long)puVar22 - (long)puVar36;
                }
                goto LAB_0019833c;
              }
            }
            if ((uVar16 <= uVar34) ||
               ((uVar16 = pUVar10[uVar16 & uVar33 - 1], uVar16 <= uVar25 ||
                (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00198631;
          } while( true );
        }
      }
      else {
        pUVar10 = ms->chainTable;
        uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar15 = (ms->window).dictLimit;
        uVar25 = (ms->window).lowLimit;
        uVar37 = UVar35 - (int)pBVar28;
        uVar34 = uVar37 - uVar33;
        if (uVar37 < uVar33) {
          uVar34 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar25 < uVar16) {
          iVar32 = 1 << ((byte)uVar7 & 0x1f);
          local_118 = 99999999;
          local_160 = 3;
          do {
            uVar20 = (ulong)uVar16;
            if (uVar16 < uVar15) {
              if (*(int *)(pBVar24 + uVar20) == (int)*puVar36) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar36 + 4),pBVar24 + uVar20 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar15,pBVar28 + uVar15);
                uVar20 = sVar18 + 4;
LAB_001985d3:
                if ((local_160 < uVar20) &&
                   (local_118 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar20,
                   (ulong *)((long)puVar36 + uVar20) == iEnd)) goto LAB_00198631;
              }
            }
            else {
              puVar26 = (ulong *)(pBVar28 + uVar20);
              if (*(BYTE *)(local_160 + (long)puVar26) == *(BYTE *)((long)puVar36 + local_160)) {
                puVar22 = puVar36;
                if (puVar36 < puVar1) {
                  if (*puVar26 == *puVar36) {
                    lVar30 = 0;
                    do {
                      puVar22 = (ulong *)((long)puVar36 + lVar30 + 8);
                      if (puVar1 <= puVar22) {
                        puVar26 = (ulong *)(pBVar28 + lVar30 + uVar20 + 8);
                        goto LAB_0019858d;
                      }
                      lVar11 = lVar30 + uVar20 + 8;
                      lVar30 = lVar30 + 8;
                    } while (*(ulong *)(pBVar28 + lVar11) == *puVar22);
                    uVar21 = *puVar22 ^ *(ulong *)(pBVar28 + lVar11);
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = (uVar20 >> 3 & 0x1fffffff) + lVar30;
                  }
                  else {
                    uVar21 = *puVar36 ^ *puVar26;
                    uVar20 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar20 = uVar20 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0019858d:
                  if ((puVar22 < puVar2) && ((int)*puVar26 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar26 = (ulong *)((long)puVar26 + 4);
                  }
                  if ((puVar22 < puVar3) && ((short)*puVar26 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar26 = (ulong *)((long)puVar26 + 2);
                  }
                  if (puVar22 < iEnd) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar22));
                  }
                  uVar20 = (long)puVar22 - (long)puVar36;
                }
                goto LAB_001985d3;
              }
            }
            if ((uVar16 <= uVar34) ||
               ((uVar16 = pUVar10[uVar16 & uVar33 - 1], uVar16 <= uVar25 ||
                (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00198631;
          } while( true );
        }
      }
      local_118 = 99999999;
      local_160 = 3;
LAB_00198631:
      local_100 = uVar19;
      if (uVar19 < local_160) {
        local_100 = local_160;
      }
      if (local_100 < 4) {
        puVar36 = (ulong *)((long)puVar36 + ((long)puVar36 - (long)src >> 8) + 1);
      }
      else {
        puVar26 = puVar36;
        if (local_160 <= uVar19) {
          local_118 = 0;
          puVar26 = (ulong *)((long)puVar36 + 1U);
        }
        if (puVar36 < puVar4) {
LAB_001986c8:
          puVar22 = (ulong *)((long)puVar36 + 1);
          if (local_118 == 0) {
            local_118 = 0;
          }
          else {
            uVar15 = (iVar14 + 1) - local_154;
            pBVar28 = pBVar8;
            if (uVar15 < uVar5) {
              pBVar28 = pBVar9;
            }
            if ((uVar6 < uVar15 && 2 < iVar13 - uVar15) &&
               (*(int *)puVar22 == *(int *)(pBVar28 + uVar15))) {
              puVar27 = iEnd;
              if (uVar15 < uVar5) {
                puVar27 = puVar17;
              }
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 5),(BYTE *)((long)(pBVar28 + uVar15) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar27,iStart);
              if (sVar18 < 0xfffffffffffffffc) {
                uVar25 = (int)local_118 + 1;
                uVar15 = 0x1f;
                if (uVar25 != 0) {
                  for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)local_100 * 3 + -0x1e) < (int)(sVar18 + 4) * 3) {
                  local_118 = 0;
                  puVar26 = puVar22;
                  local_100 = sVar18 + 4;
                }
              }
            }
          }
          UVar35 = (U32)puVar22;
          if (cParams->searchLength - 6 < 2) {
            pUVar10 = ms->chainTable;
            uVar37 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            pBVar24 = (ms->window).dictBase;
            uVar15 = (ms->window).dictLimit;
            uVar25 = (ms->window).lowLimit;
            uVar34 = UVar35 - (int)pBVar28;
            uVar33 = uVar34 - uVar37;
            if (uVar34 < uVar37) {
              uVar33 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar16 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar35);
            if (uVar25 < uVar16) {
              iVar32 = 1 << ((byte)uVar7 & 0x1f);
              local_120 = 99999999;
              local_160 = 3;
              do {
                uVar19 = (ulong)uVar16;
                if (uVar16 < uVar15) {
                  if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar24 + uVar19 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar15,pBVar28 + uVar15);
                    uVar19 = sVar18 + 4;
LAB_00198a4c:
                    if ((local_160 < uVar19) &&
                       (local_120 = (ulong)((uVar34 + 2) - uVar16), local_160 = uVar19,
                       (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199012;
                  }
                }
                else {
                  puVar27 = (ulong *)(pBVar28 + uVar19);
                  if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160))
                  {
                    puVar23 = puVar22;
                    if (puVar22 < puVar1) {
                      if (*puVar27 == *puVar22) {
                        lVar30 = 0;
                        do {
                          puVar23 = (ulong *)((long)puVar36 + lVar30 + 9);
                          if (puVar1 <= puVar23) {
                            puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                            goto LAB_00198a02;
                          }
                          lVar11 = lVar30 + uVar19 + 8;
                          lVar30 = lVar30 + 8;
                        } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                        uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                      }
                      else {
                        uVar20 = *puVar22 ^ *puVar27;
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = uVar19 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00198a02:
                      if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar27 = (ulong *)((long)puVar27 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar27 = (ulong *)((long)puVar27 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                      }
                      uVar19 = (long)puVar23 - (long)puVar22;
                    }
                    goto LAB_00198a4c;
                  }
                }
                if ((uVar16 <= uVar33) ||
                   ((uVar16 = pUVar10[uVar16 & uVar37 - 1], uVar16 <= uVar25 ||
                    (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199012;
              } while( true );
            }
          }
          else if (cParams->searchLength == 5) {
            pUVar10 = ms->chainTable;
            uVar37 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            pBVar24 = (ms->window).dictBase;
            uVar15 = (ms->window).dictLimit;
            uVar25 = (ms->window).lowLimit;
            uVar33 = UVar35 - (int)pBVar28;
            uVar34 = uVar33 - uVar37;
            if (uVar33 < uVar37) {
              uVar34 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar16 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar35);
            if (uVar25 < uVar16) {
              iVar32 = 1 << ((byte)uVar7 & 0x1f);
              local_120 = 99999999;
              local_160 = 3;
              do {
                uVar19 = (ulong)uVar16;
                if (uVar16 < uVar15) {
                  if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar24 + uVar19 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar15,pBVar28 + uVar15);
                    uVar19 = sVar18 + 4;
LAB_00198d11:
                    if ((local_160 < uVar19) &&
                       (local_120 = (ulong)((uVar33 + 2) - uVar16), local_160 = uVar19,
                       (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199012;
                  }
                }
                else {
                  puVar27 = (ulong *)(pBVar28 + uVar19);
                  if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160))
                  {
                    puVar23 = puVar22;
                    if (puVar22 < puVar1) {
                      if (*puVar27 == *puVar22) {
                        lVar30 = 0;
                        do {
                          puVar23 = (ulong *)((long)puVar36 + lVar30 + 9);
                          if (puVar1 <= puVar23) {
                            puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                            goto LAB_00198ccb;
                          }
                          lVar11 = lVar30 + uVar19 + 8;
                          lVar30 = lVar30 + 8;
                        } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                        uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                      }
                      else {
                        uVar20 = *puVar22 ^ *puVar27;
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = uVar19 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00198ccb:
                      if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar27 = (ulong *)((long)puVar27 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar27 = (ulong *)((long)puVar27 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                      }
                      uVar19 = (long)puVar23 - (long)puVar22;
                    }
                    goto LAB_00198d11;
                  }
                }
                if ((uVar16 <= uVar34) ||
                   ((uVar16 = pUVar10[uVar16 & uVar37 - 1], uVar16 <= uVar25 ||
                    (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199012;
              } while( true );
            }
          }
          else {
            pUVar10 = ms->chainTable;
            uVar37 = 1 << ((byte)cParams->chainLog & 0x1f);
            pBVar28 = (ms->window).base;
            pBVar24 = (ms->window).dictBase;
            uVar15 = (ms->window).dictLimit;
            uVar25 = (ms->window).lowLimit;
            uVar33 = UVar35 - (int)pBVar28;
            uVar34 = uVar33 - uVar37;
            if (uVar33 < uVar37) {
              uVar34 = 0;
            }
            uVar7 = cParams->searchLog;
            uVar16 = ZSTD_insertAndFindFirstIndex_internal
                               (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                                (BYTE *)(ulong)cParams->hashLog,UVar35);
            if (uVar25 < uVar16) {
              iVar32 = 1 << ((byte)uVar7 & 0x1f);
              local_120 = 99999999;
              local_160 = 3;
              do {
                uVar19 = (ulong)uVar16;
                if (uVar16 < uVar15) {
                  if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
                    sVar18 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar36 + 5),pBVar24 + uVar19 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar15,pBVar28 + uVar15);
                    uVar19 = sVar18 + 4;
LAB_00198fcf:
                    if ((local_160 < uVar19) &&
                       (local_120 = (ulong)((uVar33 + 2) - uVar16), local_160 = uVar19,
                       (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199012;
                  }
                }
                else {
                  puVar27 = (ulong *)(pBVar28 + uVar19);
                  if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160))
                  {
                    puVar23 = puVar22;
                    if (puVar22 < puVar1) {
                      if (*puVar27 == *puVar22) {
                        lVar30 = 0;
                        do {
                          puVar23 = (ulong *)((long)puVar36 + lVar30 + 9);
                          if (puVar1 <= puVar23) {
                            puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                            goto LAB_00198f89;
                          }
                          lVar11 = lVar30 + uVar19 + 8;
                          lVar30 = lVar30 + 8;
                        } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                        uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                      }
                      else {
                        uVar20 = *puVar22 ^ *puVar27;
                        uVar19 = 0;
                        if (uVar20 != 0) {
                          for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar19 = uVar19 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00198f89:
                      if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar27 = (ulong *)((long)puVar27 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar27 = (ulong *)((long)puVar27 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                      }
                      uVar19 = (long)puVar23 - (long)puVar22;
                    }
                    goto LAB_00198fcf;
                  }
                }
                if ((uVar16 <= uVar34) ||
                   ((uVar16 = pUVar10[uVar16 & uVar37 - 1], uVar16 <= uVar25 ||
                    (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199012;
              } while( true );
            }
          }
          goto LAB_0019907d;
        }
LAB_00199a1f:
        if (local_118 == 0) {
          UVar35 = 1;
        }
        else {
          pBVar31 = (BYTE *)((long)puVar26 + (2 - (long)(pBVar8 + local_118)));
          pBVar24 = iStart;
          pBVar28 = pBVar8;
          if ((uint)pBVar31 < uVar5) {
            pBVar24 = pBVar9 + uVar6;
            pBVar28 = pBVar9;
          }
          if ((src < puVar26) && (uVar19 = (ulong)pBVar31 & 0xffffffff, pBVar24 < pBVar28 + uVar19))
          {
            pBVar28 = pBVar28 + uVar19;
            do {
              puVar36 = (ulong *)((long)puVar26 + -1);
              pBVar28 = pBVar28 + -1;
              if ((*(BYTE *)puVar36 != *pBVar28) ||
                 (local_100 = local_100 + 1, puVar26 = puVar36, puVar36 <= src)) break;
            } while (pBVar24 < pBVar28);
          }
          local_90 = local_154;
          local_154 = (int)local_118 - 2;
          UVar35 = (int)local_118 + 1;
        }
        uVar19 = (long)puVar26 - (long)src;
        puVar22 = (ulong *)seqStore->lit;
        puVar36 = (ulong *)((long)puVar22 + uVar19);
        do {
          *puVar22 = *src;
          puVar22 = puVar22 + 1;
          src = (void *)((long)src + 8);
        } while (puVar22 < puVar36);
        seqStore->lit = seqStore->lit + uVar19;
        if (uVar19 < 0x10000) {
          psVar29 = seqStore->sequences;
        }
        else {
          seqStore->longLengthID = 1;
          psVar29 = seqStore->sequences;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar29 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar29->litLength = (U16)uVar19;
        psVar29->offset = UVar35;
        if (0xffff < local_100 - 3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar29 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar29->matchLength = (U16)(local_100 - 3);
        seqStore->sequences = psVar29 + 1;
        uVar15 = local_154;
        for (src = (void *)((long)puVar26 + local_100); local_154 = uVar15, puVar36 = (ulong *)src,
            src <= puVar4; src = (void *)((long)src + sVar18 + 4)) {
          uVar15 = (uint)((long)src - (long)(pBVar8 + local_90));
          pBVar28 = pBVar8;
          if (uVar15 < uVar5) {
            pBVar28 = pBVar9;
          }
          if (((uVar15 <= uVar6) || (iVar13 - uVar15 < 3)) ||
             ((int)*src != *(int *)(pBVar28 + ((long)src - (long)(pBVar8 + local_90) & 0xffffffff)))
             ) break;
          puVar36 = iEnd;
          if (uVar15 < uVar5) {
            puVar36 = puVar17;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),
                              (BYTE *)((long)(pBVar28 +
                                             ((long)src - (long)(pBVar8 + local_90) & 0xffffffff)) +
                                      4),(BYTE *)iEnd,(BYTE *)puVar36,iStart);
          *(ulong *)seqStore->lit = *src;
          psVar29 = seqStore->sequences;
          psVar29->litLength = 0;
          psVar29->offset = 1;
          if (0xffff < sVar18 + 1) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar29 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar29->matchLength = (U16)(sVar18 + 1);
          seqStore->sequences = psVar29 + 1;
          uVar15 = local_90;
          local_90 = local_154;
        }
      }
    } while (puVar36 < puVar4);
  }
  *rep = local_154;
  rep[1] = local_90;
  return (long)iEnd - (long)src;
LAB_00199012:
  if (3 < local_160) {
    uVar25 = (int)local_118 + 1;
    uVar15 = 0x1f;
    if (uVar25 != 0) {
      for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar25 = (int)local_120 + 1;
    iVar32 = 0x1f;
    if (uVar25 != 0) {
      for (; uVar25 >> iVar32 == 0; iVar32 = iVar32 + -1) {
      }
    }
    iVar12 = iVar14 + 1;
    if ((int)((uVar15 ^ 0x1f) + (int)local_100 * 4 + -0x1b) < (int)local_160 * 4 - iVar32)
    goto LAB_001999bc;
  }
LAB_0019907d:
  if (puVar22 < puVar4) {
    puVar22 = (ulong *)((long)puVar36 + 2);
    if (local_118 == 0) {
      local_118 = 0;
    }
    else {
      uVar15 = (iVar14 + 2) - local_154;
      pBVar28 = pBVar8;
      if (uVar15 < uVar5) {
        pBVar28 = pBVar9;
      }
      if ((uVar6 < uVar15 && 2 < iVar13 - uVar15) && (*(int *)puVar22 == *(int *)(pBVar28 + uVar15))
         ) {
        puVar27 = iEnd;
        if (uVar15 < uVar5) {
          puVar27 = puVar17;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar36 + 6),(BYTE *)((long)(pBVar28 + uVar15) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar27,iStart);
        if (sVar18 < 0xfffffffffffffffc) {
          uVar25 = (int)local_118 + 1;
          uVar15 = 0x1f;
          if (uVar25 != 0) {
            for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          if ((int)((uVar15 ^ 0x1f) + (int)local_100 * 4 + -0x1e) < (int)(sVar18 + 4) * 4) {
            local_118 = 0;
            puVar26 = puVar22;
            local_100 = sVar18 + 4;
          }
        }
      }
    }
    UVar35 = (U32)puVar22;
    if (cParams->searchLength - 6 < 2) {
      pUVar10 = ms->chainTable;
      uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar28 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar15 = (ms->window).dictLimit;
      uVar25 = (ms->window).lowLimit;
      uVar37 = UVar35 - (int)pBVar28;
      uVar34 = uVar37 - uVar33;
      if (uVar37 < uVar33) {
        uVar34 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar16 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar35);
      if (uVar25 < uVar16) {
        iVar32 = 1 << ((byte)uVar7 & 0x1f);
        local_120 = 99999999;
        local_160 = 3;
        do {
          uVar19 = (ulong)uVar16;
          if (uVar16 < uVar15) {
            if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 6),pBVar24 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar15,pBVar28 + uVar15);
              uVar19 = sVar18 + 4;
LAB_001993cb:
              if ((local_160 < uVar19) &&
                 (local_120 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar19,
                 (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199961;
            }
          }
          else {
            puVar27 = (ulong *)(pBVar28 + uVar19);
            if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160)) {
              puVar23 = puVar22;
              if (puVar22 < puVar1) {
                if (*puVar27 == *puVar22) {
                  lVar30 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar36 + lVar30 + 10);
                    if (puVar1 <= puVar23) {
                      puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                      goto LAB_00199381;
                    }
                    lVar11 = lVar30 + uVar19 + 8;
                    lVar30 = lVar30 + 8;
                  } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                  uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                }
                else {
                  uVar20 = *puVar22 ^ *puVar27;
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00199381:
                if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                }
                uVar19 = (long)puVar23 - (long)puVar22;
              }
              goto LAB_001993cb;
            }
          }
          if ((uVar16 <= uVar34) ||
             ((uVar16 = pUVar10[uVar16 & uVar33 - 1], uVar16 <= uVar25 ||
              (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199961;
        } while( true );
      }
    }
    else if (cParams->searchLength == 5) {
      pUVar10 = ms->chainTable;
      uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar28 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar15 = (ms->window).dictLimit;
      uVar25 = (ms->window).lowLimit;
      uVar37 = UVar35 - (int)pBVar28;
      uVar34 = uVar37 - uVar33;
      if (uVar37 < uVar33) {
        uVar34 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar16 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar35);
      if (uVar25 < uVar16) {
        iVar32 = 1 << ((byte)uVar7 & 0x1f);
        local_120 = 99999999;
        local_160 = 3;
        do {
          uVar19 = (ulong)uVar16;
          if (uVar16 < uVar15) {
            if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 6),pBVar24 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar15,pBVar28 + uVar15);
              uVar19 = sVar18 + 4;
LAB_0019966e:
              if ((local_160 < uVar19) &&
                 (local_120 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar19,
                 (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199961;
            }
          }
          else {
            puVar27 = (ulong *)(pBVar28 + uVar19);
            if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160)) {
              puVar23 = puVar22;
              if (puVar22 < puVar1) {
                if (*puVar27 == *puVar22) {
                  lVar30 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar36 + lVar30 + 10);
                    if (puVar1 <= puVar23) {
                      puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                      goto LAB_00199628;
                    }
                    lVar11 = lVar30 + uVar19 + 8;
                    lVar30 = lVar30 + 8;
                  } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                  uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                }
                else {
                  uVar20 = *puVar22 ^ *puVar27;
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00199628:
                if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                }
                uVar19 = (long)puVar23 - (long)puVar22;
              }
              goto LAB_0019966e;
            }
          }
          if ((uVar16 <= uVar34) ||
             ((uVar16 = pUVar10[uVar16 & uVar33 - 1], uVar16 <= uVar25 ||
              (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199961;
        } while( true );
      }
    }
    else {
      pUVar10 = ms->chainTable;
      uVar34 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar28 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar15 = (ms->window).dictLimit;
      uVar25 = (ms->window).lowLimit;
      uVar37 = UVar35 - (int)pBVar28;
      uVar33 = uVar37 - uVar34;
      if (uVar37 < uVar34) {
        uVar33 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar16 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar35);
      if (uVar25 < uVar16) {
        iVar32 = 1 << ((byte)uVar7 & 0x1f);
        local_120 = 99999999;
        local_160 = 3;
        do {
          uVar19 = (ulong)uVar16;
          if (uVar16 < uVar15) {
            if (*(int *)(pBVar24 + uVar19) == *(int *)puVar22) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar36 + 6),pBVar24 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar15,pBVar28 + uVar15);
              uVar19 = sVar18 + 4;
LAB_00199912:
              if ((local_160 < uVar19) &&
                 (local_120 = (ulong)((uVar37 + 2) - uVar16), local_160 = uVar19,
                 (ulong *)((long)puVar22 + uVar19) == iEnd)) goto LAB_00199961;
            }
          }
          else {
            puVar27 = (ulong *)(pBVar28 + uVar19);
            if (*(BYTE *)(local_160 + (long)puVar27) == *(BYTE *)((long)puVar22 + local_160)) {
              puVar23 = puVar22;
              if (puVar22 < puVar1) {
                if (*puVar27 == *puVar22) {
                  lVar30 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar36 + lVar30 + 10);
                    if (puVar1 <= puVar23) {
                      puVar27 = (ulong *)(pBVar28 + lVar30 + uVar19 + 8);
                      goto LAB_001998c7;
                    }
                    lVar11 = lVar30 + uVar19 + 8;
                    lVar30 = lVar30 + 8;
                  } while (*(ulong *)(pBVar28 + lVar11) == *puVar23);
                  uVar20 = *puVar23 ^ *(ulong *)(pBVar28 + lVar11);
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar30;
                }
                else {
                  uVar20 = *puVar22 ^ *puVar27;
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001998c7:
                if ((puVar23 < puVar2) && ((int)*puVar27 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar27 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar23));
                }
                uVar19 = (long)puVar23 - (long)puVar22;
              }
              goto LAB_00199912;
            }
          }
          if ((uVar16 <= uVar33) ||
             ((uVar16 = pUVar10[uVar16 & uVar34 - 1], uVar16 <= uVar25 ||
              (iVar32 = iVar32 + -1, iVar32 == 0)))) goto LAB_00199961;
        } while( true );
      }
    }
  }
  goto LAB_00199a1f;
LAB_00199961:
  if (local_160 < 4) goto LAB_00199a1f;
  uVar25 = (int)local_118 + 1;
  uVar15 = 0x1f;
  if (uVar25 != 0) {
    for (; uVar25 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar25 = (int)local_120 + 1;
  iVar32 = 0x1f;
  if (uVar25 != 0) {
    for (; uVar25 >> iVar32 == 0; iVar32 = iVar32 + -1) {
    }
  }
  iVar12 = iVar14 + 2;
  if ((int)local_160 * 4 - iVar32 <= (int)((uVar15 ^ 0x1f) + (int)local_100 * 4 + -0x18))
  goto LAB_00199a1f;
LAB_001999bc:
  iVar14 = iVar12;
  puVar36 = puVar22;
  puVar26 = puVar36;
  local_118 = local_120;
  local_100 = local_160;
  if (puVar4 <= puVar36) goto LAB_00199a1f;
  goto LAB_001986c8;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 2);
}